

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_Locking::_Run(_Test_Locking *this)

{
  bool bVar1;
  Tester *this_00;
  Tester local_220;
  Options local_80;
  DB local_20;
  Status s;
  DB *db2;
  _Test_Locking *this_local;
  
  s.state_ = (char *)0x0;
  DBTest::CurrentOptions(&local_80,&this->super_DBTest);
  DB::Open(&local_20,&local_80,(string *)this,(DB **)&s);
  test::Tester::Tester
            (&local_220,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x6af);
  bVar1 = Status::ok((Status *)&local_20);
  this_00 = test::Tester::Is(&local_220,(bool)(~bVar1 & 1),"!s.ok()");
  test::Tester::operator<<(this_00,(char (*) [38])"Locking did not prevent re-opening db");
  test::Tester::~Tester(&local_220);
  Status::~Status((Status *)&local_20);
  return;
}

Assistant:

TEST(DBTest, Locking) {
  DB* db2 = nullptr;
  Status s = DB::Open(CurrentOptions(), dbname_, &db2);
  ASSERT_TRUE(!s.ok()) << "Locking did not prevent re-opening db";
}